

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr __thiscall c4::yml::Tree::lookup_result::resolved(lookup_result *this)

{
  code *pcVar1;
  bool bVar2;
  ulong len_;
  csubstr cVar3;
  basic_substring<const_char> local_20;
  
  len_ = this->path_pos;
  if ((len_ != 0xffffffffffffffff) && ((this->path).len < len_)) {
    if ((s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        cVar3 = (csubstr)(*pcVar1)();
        return cVar3;
      }
    }
    handle_error(0x1fe047,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x154e,"num <= len || num == npos");
  }
  if (len_ == 0xffffffffffffffff) {
    len_ = (this->path).len;
  }
  basic_substring<const_char>::basic_substring(&local_20,(this->path).str,len_);
  if ((local_20.len != 0) && (local_20.str[local_20.len - 1] == '.')) {
    basic_substring<const_char>::basic_substring(&local_20,local_20.str,local_20.len - 1);
  }
  cVar3.len = local_20.len;
  cVar3.str = local_20.str;
  return cVar3;
}

Assistant:

csubstr Tree::lookup_result::resolved() const
{
    csubstr p = path.first(path_pos);
    if(p.ends_with('.'))
        p = p.first(p.len-1);
    return p;
}